

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::a64::ARMRAPass::emitSave(ARMRAPass *this,uint32_t workId,uint32_t srcPhysId)

{
  VirtReg *pVVar1;
  Error EVar2;
  RAWorkReg *pRVar3;
  RAWorkReg *pRVar4;
  char *comment;
  BaseReg srcReg;
  BaseMem dstMem;
  Operand_ local_48;
  char *local_38;
  
  pRVar3 = BaseRAPass::workRegById(&this->super_BaseRAPass,workId);
  BaseRAPass::workRegAsMem((BaseRAPass *)&stack0xffffffffffffffd0,(RAWorkReg *)this);
  local_48._signature._bits = (pRVar3->_signature)._bits;
  local_48._data[0] = 0;
  local_48._data[1] = 0;
  local_48._baseId = srcPhysId;
  if (((this->super_BaseRAPass)._diagnosticOptions & kRAAnnotate) == kNone) {
    comment = (char *)0x0;
  }
  else {
    pRVar4 = BaseRAPass::workRegById(&this->super_BaseRAPass,workId);
    pVVar1 = pRVar4->_virtReg;
    if (*(uint *)&(pVVar1->_name).field_0 < 0xc) {
      local_38 = (char *)((long)&(pVVar1->_name).field_0 + 4);
    }
    else {
      local_38 = *(char **)((long)&(pVVar1->_name).field_0 + 8);
    }
    String::assignFormat<char_const*>
              (&(this->super_BaseRAPass)._tmpString.super_String,"<SAVE> %s",&local_38);
    if ((this->super_BaseRAPass)._tmpString.super_String.field_0._type < 0x1f) {
      comment = (this->super_BaseRAPass)._tmpString.super_String.field_0._small.data;
    }
    else {
      comment = (this->super_BaseRAPass)._tmpString.super_String.field_0._large.data;
    }
  }
  EVar2 = EmitHelper::emitRegMove
                    (&this->_emitHelper,(Operand_ *)&stack0xffffffffffffffd0,&local_48,
                     pRVar3->_virtReg->_typeId,comment);
  return EVar2;
}

Assistant:

Error ARMRAPass::emitSave(uint32_t workId, uint32_t srcPhysId) noexcept {
  RAWorkReg* wReg = workRegById(workId);
  BaseMem dstMem(workRegAsMem(wReg));
  BaseReg srcReg(wReg->signature(), srcPhysId);

  const char* comment = nullptr;

#ifndef ASMJIT_NO_LOGGING
  if (hasDiagnosticOption(DiagnosticOptions::kRAAnnotate)) {
    _tmpString.assignFormat("<SAVE> %s", workRegById(workId)->name());
    comment = _tmpString.data();
  }
#endif

  return _emitHelper.emitRegMove(dstMem, srcReg, wReg->typeId(), comment);
}